

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O3

int32_t WebRtcAgc_ProcessDigital
                  (DigitalAgc *stt,int16_t **in_near,size_t num_bands,int16_t **out,uint32_t FS,
                  int16_t lowlevelSignal)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  short sVar6;
  uint uVar7;
  int16_t *piVar8;
  byte bVar9;
  short sVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int16_t iVar23;
  size_t sVar24;
  long lVar25;
  undefined1 auVar26 [16];
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int32_t gains [11];
  int32_t env [10];
  sbyte local_94;
  uint local_88 [11];
  uint auStack_5c [11];
  
  if ((int)FS < 32000) {
    if (FS == 8000) {
      local_94 = 1;
      lVar16 = 8;
      goto LAB_0012f6d0;
    }
    if (FS != 16000) {
      return -1;
    }
  }
  else if ((FS != 48000) && (FS != 32000)) {
    return -1;
  }
  local_94 = 0;
  lVar16 = 0x10;
LAB_0012f6d0:
  iVar18 = (int)lVar16;
  if (num_bands != 0) {
    sVar24 = 0;
    do {
      if (in_near[sVar24] != out[sVar24]) {
        memcpy(out[sVar24],in_near[sVar24],(ulong)(uint)(iVar18 * 4) * 5);
      }
      sVar24 = sVar24 + 1;
    } while (num_bands != sVar24);
  }
  sVar6 = WebRtcAgc_ProcessVad(&stt->vadNearend,*out,(ulong)(uint)(iVar18 * 2) * 5);
  if (10 < (stt->vadFarend).counter) {
    sVar6 = (short)((uint)(sVar6 * 3 - (int)(stt->vadFarend).logRatio) >> 2);
  }
  sVar10 = -0x41;
  if (sVar6 < 0x401) {
    if (sVar6 < 0) {
      sVar10 = 0;
    }
    else {
      sVar10 = (short)((uint)(-sVar6 * 0x41) >> 10);
    }
  }
  if (stt->agcMode != 3) {
    uVar11 = (stt->vadNearend).stdLongTerm;
    sVar6 = 0;
    if ((3999 < (short)uVar11) && (sVar6 = sVar10, uVar11 < 0x1fa0)) {
      sVar6 = (short)((int)sVar10 * ((int)(short)uVar11 - 4000U & 0xffff) >> 0xc);
    }
    sVar10 = 0;
    if (lowlevelSignal == 0) {
      sVar10 = sVar6;
    }
  }
  piVar8 = *out;
  lVar17 = 0;
  do {
    lVar19 = 0;
    auVar26 = (undefined1  [16])0x0;
    do {
      uVar1 = *(ulong *)(piVar8 + lVar19);
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar1;
      auVar2._12_2_ = (short)(uVar1 >> 0x30);
      auVar3._8_2_ = (short)(uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._10_4_ = auVar2._10_4_;
      auVar5._6_8_ = 0;
      auVar5._0_6_ = auVar3._8_6_;
      auVar4._4_2_ = (short)(uVar1 >> 0x10);
      auVar4._0_4_ = (uint)uVar1;
      auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
      auVar28._0_4_ = (uint)uVar1 & 0xffff;
      auVar28._4_10_ = auVar4._4_10_;
      auVar28._14_2_ = 0;
      auVar28 = pmaddwd(auVar28,auVar28);
      auVar30._0_4_ = -(uint)(auVar26._0_4_ < auVar28._0_4_);
      auVar30._4_4_ = -(uint)(auVar26._4_4_ < auVar28._4_4_);
      auVar30._8_4_ = -(uint)(auVar26._8_4_ < auVar28._8_4_);
      auVar30._12_4_ = -(uint)(auVar26._12_4_ < auVar28._12_4_);
      auVar26 = ~auVar30 & auVar26 | auVar28 & auVar30;
      lVar19 = lVar19 + 4;
    } while (lVar16 != lVar19);
    auVar29._0_8_ = auVar26._8_8_;
    auVar29._8_4_ = auVar26._8_4_;
    auVar29._12_4_ = auVar26._12_4_;
    auVar31._0_4_ = -(uint)(auVar26._8_4_ < auVar26._0_4_);
    auVar31._4_4_ = -(uint)(auVar26._12_4_ < auVar26._4_4_);
    auVar31._8_8_ = 0;
    auVar26 = ~auVar31 & auVar29 | auVar26 & auVar31;
    uVar7 = auVar26._0_4_;
    uVar20 = auVar26._4_4_;
    uVar27 = -(uint)((int)uVar20 < (int)uVar7);
    auStack_5c[lVar17 + 1] = ~uVar27 & uVar20 | uVar7 & uVar27;
    lVar17 = lVar17 + 1;
    piVar8 = (int16_t *)((long)piVar8 + (ulong)(uint)(iVar18 * 2));
  } while (lVar17 != 10);
  iVar18 = stt->gain;
  uVar27 = stt->capacitorSlow;
  uVar7 = stt->capacitorFast;
  lVar17 = 1;
  do {
    uVar7 = ((int)((uVar7 & 0xffff) * -1000) >> 0x10) + ((int)uVar7 >> 0x10) * -1000 + uVar7;
    uVar20 = auStack_5c[lVar17];
    if ((int)uVar7 < (int)uVar20) {
      uVar7 = uVar20;
    }
    uVar13 = uVar20 - uVar27;
    if (uVar13 == 0 || (int)uVar20 < (int)uVar27) {
      uVar27 = ((int)((uVar27 & 0xffff) * (int)sVar10) >> 0x10) +
               ((int)uVar27 >> 0x10) * (int)sVar10 + uVar27;
    }
    else {
      uVar27 = ((uVar13 & 0xffff) * 500 >> 0x10) + ((int)uVar13 >> 0x10) * 500 + uVar27;
    }
    uVar20 = uVar27;
    if ((int)uVar27 < (int)uVar7) {
      uVar20 = uVar7;
    }
    iVar21 = 0x1f;
    if (uVar20 != 0) {
      for (; uVar20 >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    uVar11 = (ushort)iVar21 ^ 0x1f;
    if (uVar20 == 0) {
      uVar11 = 0x1f;
    }
    uVar20 = (uVar20 << ((byte)uVar11 & 0x1f)) >> 0x13;
    local_88[lVar17] =
         ((int)((stt->gainTable[(ulong)uVar11 - 1] - stt->gainTable[uVar11]) * (uVar20 & 0xfff)) >>
         0xc) + stt->gainTable[uVar11];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0xb);
  iVar21 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar21 == 0; iVar21 = iVar21 + -1) {
    }
  }
  uVar12 = 0x1f;
  if (uVar7 != 0) {
    uVar12 = (ushort)iVar21 ^ 0x1f;
  }
  stt->capacitorFast = uVar7;
  stt->capacitorSlow = uVar27;
  sVar6 = (uVar12 * 0x200 -
          ((short)((uint)uVar11 * 0x2000000 + (uVar20 & 0xff8) * -0x2000 >> 0x10) +
           (short)*(undefined4 *)&(stt->vadNearend).stdShortTerm +
          ((ushort)((uVar7 << ((byte)uVar12 & 0x1f)) >> 0x16) & 0x1ff))) + 1000;
  if (sVar6 < 0) {
    stt->gatePrevious = 0;
  }
  else {
    sVar6 = (short)((uint)(stt->gatePrevious * 7 + (int)sVar6) >> 3);
    stt->gatePrevious = sVar6;
    if (0 < sVar6) {
      iVar21 = (-((int)sVar6 - 0x9c4U) >> 5) + 0xb2;
      if (0x9c3 < (uint)(int)sVar6) {
        iVar21 = 0xb2;
      }
      iVar14 = stt->gainTable[0];
      lVar17 = 1;
      do {
        uVar27 = local_88[lVar17] - iVar14;
        iVar22 = (int)(uVar27 * iVar21) >> 8;
        if (0x800000 < (int)uVar27) {
          iVar22 = (uVar27 >> 8) * iVar21;
        }
        local_88[lVar17] = iVar22 + iVar14;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0xb);
    }
  }
  lVar17 = 0;
  do {
    uVar27 = local_88[lVar17 + 1];
    lVar19 = lVar17 + 1;
    lVar17 = lVar17 + 1;
    uVar7 = 0x1f;
    if (uVar27 != 0) {
      for (; uVar27 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = (uVar7 ^ 0xffe0) + 0x12 & 0xffff;
    if ((int)uVar27 < 0x2d413cd) {
      uVar7 = 10;
    }
    bVar9 = (byte)uVar7;
    iVar21 = ((int)uVar27 >> (bVar9 & 0x1f)) + 1;
    uVar13 = iVar21 * iVar21;
    iVar21 = ((int)auStack_5c[lVar19] >> 0xc) + 1;
    uVar20 = 0x7fff >> (bVar9 * '\x02' - 0x16 & 0x1f);
    if (uVar7 < 0xc) {
      uVar20 = 0x7fff << (bVar9 * -2 + 0x16 & 0x1f);
    }
    if ((int)uVar20 < (int)(((int)((uVar13 & 0x1fff) * iVar21) >> 0xd) + (uVar13 >> 0xd) * iVar21))
    {
      do {
        if ((int)uVar27 < 0x800000) {
          iVar22 = uVar27 * 0xfd;
          iVar14 = iVar22 + 0xff;
          if (-1 < iVar22) {
            iVar14 = iVar22;
          }
          uVar27 = iVar14 >> 8;
        }
        else {
          uVar27 = (uVar27 >> 8) * 0xfd;
        }
        iVar14 = ((int)uVar27 >> (bVar9 & 0x1f)) + 1;
        uVar7 = iVar14 * iVar14;
      } while ((int)uVar20 <
               (int)(((int)((uVar7 & 0x1fff) * iVar21) >> 0xd) + (uVar7 >> 0xd) * iVar21));
      local_88[lVar17] = uVar27;
    }
  } while (lVar17 != 10);
  lVar17 = 2;
  uVar27 = local_88[1];
  do {
    uVar7 = local_88[lVar17];
    if ((int)uVar7 <= (int)uVar27) {
      uVar27 = uVar7;
    }
    local_88[lVar17 + -1] = uVar27;
    lVar17 = lVar17 + 1;
    uVar27 = uVar7;
  } while (lVar17 != 0xb);
  stt->gain = local_88[10];
  iVar21 = iVar18 << 4;
  lVar17 = 0;
  do {
    if (num_bands != 0) {
      sVar24 = 0;
      do {
        iVar14 = (int)out[sVar24][lVar17];
        iVar22 = (iVar21 + 0x7f >> 7) * iVar14 >> 0x10;
        iVar23 = 0x7fff;
        if ((iVar22 < 0x1000) && (iVar23 = -0x8000, -0x1001 < iVar22)) {
          iVar23 = (int16_t)((uint)(iVar14 * (iVar21 >> 4)) >> 0x10);
        }
        out[sVar24][lVar17] = iVar23;
        sVar24 = sVar24 + 1;
      } while (num_bands != sVar24);
    }
    iVar21 = iVar21 + (local_88[1] - iVar18 << local_94);
    lVar17 = lVar17 + 1;
  } while (lVar17 != lVar16);
  lVar17 = 1;
  do {
    lVar15 = lVar17 + 1;
    uVar27 = local_88[lVar17 + 1];
    iVar18 = local_88[1] << 4;
    lVar19 = 0;
    do {
      if (num_bands != 0) {
        sVar24 = 0;
        do {
          lVar25 = (long)out[sVar24][lVar17 * lVar16 + lVar19] * (long)(iVar18 >> 4) >> 0x10;
          if (lVar25 < -0x7fff) {
            lVar25 = -0x8000;
          }
          if (0x7ffe < lVar25) {
            lVar25 = 0x7fff;
          }
          out[sVar24][lVar17 * lVar16 + lVar19] = (int16_t)lVar25;
          sVar24 = sVar24 + 1;
        } while (num_bands != sVar24);
      }
      iVar18 = iVar18 + (uVar27 - local_88[1] << local_94);
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar16);
    lVar17 = lVar15;
    local_88[1] = uVar27;
  } while (lVar15 != 10);
  return 0;
}

Assistant:

int32_t WebRtcAgc_ProcessDigital(DigitalAgc *stt, const int16_t *const *in_near, size_t num_bands, int16_t *const *out,
                                 uint32_t FS, int16_t lowlevelSignal) {
    // array for gains (one value per ms, incl start & end)
    int32_t gains[11];

    int32_t out_tmp, tmp32;
    int32_t env[10];
    int32_t max_nrg;
    int32_t cur_level;
    int32_t gain32, delta;
    int16_t logratio;
    int16_t lower_thr, upper_thr;
    int16_t zeros = 0, zeros_fast, frac = 0;
    int16_t decay;
    int16_t gate, gain_adj;
    int16_t k;
    size_t n, i, L;
    int16_t L2;  // samples/subframe

    // determine number of samples per ms
    if (FS == 8000) {
        L = 8;
        L2 = 3;
    } else if (FS == 16000 || FS == 32000 || FS == 48000) {
        L = 16;
        L2 = 4;
    } else {
        return -1;
    }

    for (i = 0; i < num_bands; ++i) {
        if (in_near[i] != out[i]) {
            // Only needed if they don't already point to the same place.
            memcpy(out[i], in_near[i], 10 * L * sizeof(in_near[i][0]));
        }
    }
    // VAD for near end
    logratio = WebRtcAgc_ProcessVad(&stt->vadNearend, out[0], L * 10);

    // Account for far end VAD
    if (stt->vadFarend.counter > 10) {
        tmp32 = 3 * logratio;
        logratio = (int16_t) ((tmp32 - stt->vadFarend.logRatio) >> 2);
    }

    // Determine decay factor depending on VAD
    //  upper_thr = 1.0f;
    //  lower_thr = 0.25f;
    upper_thr = 1024;  // Q10
    lower_thr = 0;     // Q10
    if (logratio > upper_thr) {
        // decay = -2^17 / DecayTime;  ->  -65
        decay = -65;
    } else if (logratio < lower_thr) {
        decay = 0;
    } else {
        // decay = (int16_t)(((lower_thr - logratio)
        //       * (2^27/(DecayTime*(upper_thr-lower_thr)))) >> 10);
        // SUBSTITUTED: 2^27/(DecayTime*(upper_thr-lower_thr))  ->  65
        tmp32 = (lower_thr - logratio) * 65;
        decay = (int16_t) (tmp32 >> 10);
    }

    // adjust decay factor for long silence (detected as low standard deviation)
    // This is only done in the adaptive modes
    if (stt->agcMode != kAgcModeFixedDigital) {
        if (stt->vadNearend.stdLongTerm < 4000) {
            decay = 0;
        } else if (stt->vadNearend.stdLongTerm < 8096) {
            // decay = (int16_t)(((stt->vadNearend.stdLongTerm - 4000) * decay) >>
            // 12);
            tmp32 = (stt->vadNearend.stdLongTerm - 4000) * decay;
            decay = (int16_t) (tmp32 >> 12);
        }

        if (lowlevelSignal != 0) {
            decay = 0;
        }
    }
#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->frameCounter++;
    fprintf(stt->logFile, "%5.2f\t%d\t%d\t%d\t", (float)(stt->frameCounter) / 100, logratio, decay,
            stt->vadNearend.stdLongTerm);
#endif
    // Find max amplitude per sub frame
    // iterate over sub frames
    for (k = 0; k < 10; k++) {
        // iterate over samples
        max_nrg = 0;
        for (n = 0; n < L; n++) {
            int32_t nrg = out[0][k * L + n] * out[0][k * L + n];
            if (nrg > max_nrg) {
                max_nrg = nrg;
            }
        }
        env[k] = max_nrg;
    }

    // Calculate gain per sub frame
    gains[0] = stt->gain;
    for (k = 0; k < 10; k++) {
        // Fast envelope follower
        //  decay time = -131000 / -1000 = 131 (ms)
        stt->capacitorFast = AGC_SCALEDIFF32(-1000, stt->capacitorFast, stt->capacitorFast);
        if (env[k] > stt->capacitorFast) {
            stt->capacitorFast = env[k];
        }
        // Slow envelope follower
        if (env[k] > stt->capacitorSlow) {
            // increase capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(500, (env[k] - stt->capacitorSlow), stt->capacitorSlow);
        } else {
            // decrease capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(decay, stt->capacitorSlow, stt->capacitorSlow);
        }

        // use maximum of both capacitors as current level
        if (stt->capacitorFast > stt->capacitorSlow) {
            cur_level = stt->capacitorFast;
        } else {
            cur_level = stt->capacitorSlow;
        }
        // Translate signal level into gain, using a piecewise linear approximation
        // find number of leading zeros
        zeros = NormU32((uint32_t) cur_level);
        if (cur_level == 0) {
            zeros = 31;
        }
        tmp32 = ((uint32_t) cur_level << zeros) & 0x7FFFFFFF;
        frac = (int16_t) (tmp32 >> 19);  // Q12.
        tmp32 = (stt->gainTable[zeros - 1] - stt->gainTable[zeros]) * frac;
        gains[k + 1] = stt->gainTable[zeros] + (tmp32 >> 12);
#ifdef WEBRTC_AGC_DEBUG_DUMP
        if (k == 0) {
            fprintf(stt->logFile, "%d\t%d\t%d\t%d\t%d\n", env[0], cur_level, stt->capacitorFast, stt->capacitorSlow,
                    zeros);
        }
#endif
    }

    // Gate processing (lower gain during absence of speech)
    zeros = (zeros << 9) - (frac >> 3);
    // find number of leading zeros
    zeros_fast = NormU32((uint32_t) stt->capacitorFast);
    if (stt->capacitorFast == 0) {
        zeros_fast = 31;
    }
    tmp32 = ((uint32_t) stt->capacitorFast << zeros_fast) & 0x7FFFFFFF;
    zeros_fast <<= 9;
    zeros_fast -= (int16_t) (tmp32 >> 22);

    gate = 1000 + zeros_fast - zeros - stt->vadNearend.stdShortTerm;

    if (gate < 0) {
        stt->gatePrevious = 0;
    } else {
        tmp32 = stt->gatePrevious * 7;
        gate = (int16_t) ((gate + tmp32) >> 3);
        stt->gatePrevious = gate;
    }
    // gate < 0     -> no gate
    // gate > 2500  -> max gate
    if (gate > 0) {
        if (gate < 2500) {
            gain_adj = (2500 - gate) >> 5;
        } else {
            gain_adj = 0;
        }
        for (k = 0; k < 10; k++) {
            if ((gains[k + 1] - stt->gainTable[0]) > 8388608) {
                // To prevent wraparound
                tmp32 = (gains[k + 1] - stt->gainTable[0]) >> 8;
                tmp32 *= 178 + gain_adj;
            } else {
                tmp32 = (gains[k + 1] - stt->gainTable[0]) * (178 + gain_adj);
                tmp32 >>= 8;
            }
            gains[k + 1] = stt->gainTable[0] + tmp32;
        }
    }

    // Limit gain to avoid overload distortion
    for (k = 0; k < 10; k++) {
        // To prevent wrap around
        zeros = 10;
        if (gains[k + 1] > 47453132) {
            zeros = 16 - NormW32(gains[k + 1]);
        }
        gain32 = (gains[k + 1] >> zeros) + 1;
        gain32 *= gain32;
        // check for overflow
        while (AGC_MUL32((env[k] >> 12) + 1, gain32) > SHIFT_W32((int32_t) 32767, 2 * (1 - zeros + 10))) {
            // multiply by 253/256 ==> -0.1 dB
            if (gains[k + 1] > 8388607) {
                // Prevent wrap around
                gains[k + 1] = (gains[k + 1] / 256) * 253;
            } else {
                gains[k + 1] = (gains[k + 1] * 253) / 256;
            }
            gain32 = (gains[k + 1] >> zeros) + 1;
            gain32 *= gain32;
        }
    }
    // gain reductions should be done 1 ms earlier than gain increases
    for (k = 1; k < 10; k++) {
        if (gains[k] > gains[k + 1]) {
            gains[k] = gains[k + 1];
        }
    }
    // save start gain for next frame
    stt->gain = gains[10];

    // Apply gain
    // handle first sub frame separately
    delta = (gains[1] - gains[0]) * (1 << (4 - L2));
    gain32 = gains[0] * (1 << 4);
    // iterate over samples
    for (n = 0; n < L; n++) {
        for (i = 0; i < num_bands; ++i) {
            tmp32 = out[i][n] * ((gain32 + 127) >> 7);
            out_tmp = tmp32 >> 16;
            if (out_tmp > 4095) {
                out[i][n] = (int16_t) 32767;
            } else if (out_tmp < -4096) {
                out[i][n] = (int16_t) -32768;
            } else {
                tmp32 = out[i][n] * (gain32 >> 4);
                out[i][n] = (int16_t) (tmp32 >> 16);
            }
        }
        //

        gain32 += delta;
    }
    // iterate over subframes
    for (k = 1; k < 10; k++) {
        delta = (gains[k + 1] - gains[k]) * (1 << (4 - L2));
        gain32 = gains[k] * (1 << 4);
        // iterate over samples
        for (n = 0; n < L; n++) {
            for (i = 0; i < num_bands; ++i) {
                int64_t tmp64 = ((int64_t) (out[i][k * L + n])) * (gain32 >> 4);
                tmp64 = tmp64 >> 16;
                if (tmp64 > 32767) {
                    out[i][k * L + n] = 32767;
                } else if (tmp64 < -32768) {
                    out[i][k * L + n] = -32768;
                } else {
                    out[i][k * L + n] = (int16_t) (tmp64);
                }
            }
            gain32 += delta;
        }
    }

    return 0;
}